

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O3

void __thiscall SQClosure::~SQClosure(SQClosure *this)

{
  SQUnsignedInteger *pSVar1;
  SQWeakRef *pSVar2;
  SQClass *pSVar3;
  
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQClosure_00147058;
  pSVar2 = this->_root;
  if (pSVar2 != (SQWeakRef *)0x0) {
    pSVar1 = &(pSVar2->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar2->super_SQRefCounted)._vptr_SQRefCounted[2])();
    }
    this->_root = (SQWeakRef *)0x0;
  }
  pSVar2 = this->_env;
  if (pSVar2 != (SQWeakRef *)0x0) {
    pSVar1 = &(pSVar2->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar2->super_SQRefCounted)._vptr_SQRefCounted[2])();
    }
    this->_env = (SQWeakRef *)0x0;
  }
  pSVar3 = this->_base;
  if (pSVar3 != (SQClass *)0x0) {
    pSVar1 = &(pSVar3->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
    }
    this->_base = (SQClass *)0x0;
  }
  if (((this->super_SQCollectable).super_SQRefCounted._uiRef & 0x80000000) == 0) {
    SQCollectable::RemoveFromChain
              (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this
              );
  }
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQRefCounted_00147030;
  pSVar2 = (this->super_SQCollectable).super_SQRefCounted._weakref;
  if (pSVar2 != (SQWeakRef *)0x0) {
    (pSVar2->_obj)._type = OT_NULL;
    (pSVar2->_obj)._unVal.pTable = (SQTable *)0x0;
  }
  return;
}

Assistant:

SQClosure::~SQClosure()
{
    __ObjRelease(_root);
    __ObjRelease(_env);
    __ObjRelease(_base);
    REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain,this);
}